

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> * __thiscall
argstest::Command::GetAllFlags
          (vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
           *__return_storage_ptr__,Command *this)

{
  pointer ppBVar1;
  int iVar2;
  pointer ppBVar3;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> childFlags;
  _Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
  if ((char)iVar2 != '\0') {
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar3 = (this->super_Group).children.
                   super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar3 != ppBVar1; ppBVar3 = ppBVar3 + 1) {
      if ((this->selectedCommand == (Command *)0x0) || (((*ppBVar3)->options & Global) != None)) {
        (*(*ppBVar3)->_vptr_Base[9])(&local_40);
        std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
        insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                  ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                   __return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->
                   super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                    )local_40._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                    )local_40._M_impl.super__Vector_impl_data._M_finish);
        std::_Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::
        ~_Vector_base(&local_40);
      }
    }
    if (this->selectedCommand != (Command *)0x0) {
      (*(this->selectedCommand->super_Group).super_Base._vptr_Base[9])(&local_40);
      std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
      insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                 __return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )local_40._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )local_40._M_impl.super__Vector_impl_data._M_finish);
      std::_Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~_Vector_base
                (&local_40);
    }
    if (this->subparser != (Subparser *)0x0) {
      (*(this->subparser->super_Group).super_Base._vptr_Base[9])(&local_40);
      std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
      insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                 __return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )local_40._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )local_40._M_impl.super__Vector_impl_data._M_finish);
      std::_Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~_Vector_base
                (&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;

                if (!Matched())
                {
                    return res;
                }

                for (auto *child: Children())
                {
                    if (selectedCommand == nullptr || (child->GetOptions() & Options::Global) != Options::None)
                    {
                        auto childFlags = child->GetAllFlags();
                        res.insert(res.end(), childFlags.begin(), childFlags.end());
                    }
                }

                if (selectedCommand != nullptr)
                {
                    auto childFlags = selectedCommand->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                if (subparser != nullptr)
                {
                    auto childFlags = subparser->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                return res;
            }